

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O1

u32 duckdb_fsst_export(duckdb_fsst_encoder_t *encoder,u8 *buf)

{
  byte bVar1;
  u32 i;
  u32 uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  duckdb_fsst_encoder_t pvVar6;
  ulong uVar7;
  
  pvVar6 = *encoder;
  *(ulong *)buf =
       (ulong)*(ushort *)((long)pvVar6 + 0x26200) << 8 | 0x134140a00000001 |
       (ulong)(uint)(*(int *)((long)pvVar6 + 0x26204) << 0x10) |
       (ulong)*(ushort *)((long)pvVar6 + 0x26202) << 0x18;
  buf[8] = *(u8 *)((long)*encoder + 0x26206);
  lVar3 = 0;
  do {
    buf[lVar3 + 9] = *(u8 *)((long)*encoder + lVar3 * 2 + 0x26208);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  bVar1 = *(byte *)((long)*encoder + 0x26206);
  uVar2 = 0x11;
  if ((ushort)bVar1 < *(ushort *)((long)*encoder + 0x26200)) {
    uVar4 = (ulong)(ushort)bVar1;
    uVar5 = (ulong)(ushort)bVar1 << 4 | 0x20200;
    do {
      pvVar6 = *encoder;
      if ((int)(*(ulong *)((long)pvVar6 + uVar4 * 0x10 + 0x20208) >> 0x1c) != 0) {
        uVar7 = 0;
        do {
          buf[uVar2 + (int)uVar7] = *(u8 *)((long)pvVar6 + uVar7 + uVar5);
          uVar7 = uVar7 + 1;
          pvVar6 = *encoder;
        } while (uVar7 < (*(ulong *)((long)pvVar6 + uVar4 * 0x10 + 0x20208) >> 0x1c & 0xffffffff));
        uVar2 = uVar2 + (int)uVar7;
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar5 + 0x10;
    } while (uVar4 < *(ushort *)((long)*encoder + 0x26200));
  }
  return uVar2;
}

Assistant:

u32 duckdb_fsst_export(duckdb_fsst_encoder_t *encoder, u8 *buf) {
	Encoder *e = (Encoder*) encoder;
	// In ->version there is a versionnr, but we hide also suffixLim/terminator/nSymbols there.
	// This is sufficient in principle to *reconstruct* a duckdb_fsst_encoder_t from a duckdb_fsst_decoder_t
	// (such functionality could be useful to append compressed data to an existing block).
	//
	// However, the hash function in the encoder hash table is endian-sensitive, and given its
	// 'lossy perfect' hashing scheme is *unable* to contain other-endian-produced symbol tables.
	// Doing a endian-conversion during hashing will be slow and self-defeating.
	//
	// Overall, we could support reconstructing an encoder for incremental compression, but
	// should enforce equal-endianness. Bit of a bummer. Not going there now.
	//
	// The version field is now there just for future-proofness, but not used yet

	// version allows keeping track of fsst versions, track endianness, and encoder reconstruction
	u64 version = (FSST_VERSION << 32) |  // version is 24 bits, most significant byte is 0
	              (((u64) e->symbolTable->suffixLim) << 24) |
	              (((u64) e->symbolTable->terminator) << 16) |
	              (((u64) e->symbolTable->nSymbols) << 8) |
	              FSST_ENDIAN_MARKER; // least significant byte is nonzero

	/* do not assume unaligned reads here */
	memcpy(buf, &version, 8);
	buf[8] = e->symbolTable->zeroTerminated;
	for(u32 i=0; i<8; i++)
		buf[9+i] = (u8) e->symbolTable->lenHisto[i];
	u32 pos = 17;

	// emit only the used bytes of the symbols
	for(u32 i = e->symbolTable->zeroTerminated; i < e->symbolTable->nSymbols; i++)
		for(u32 j = 0; j < e->symbolTable->symbols[i].length(); j++)
			buf[pos++] = e->symbolTable->symbols[i].val.str[j]; // serialize used symbol bytes

	return pos; // length of what was serialized
}